

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2e4871d::PeerManagerImpl::ProcessGetCFHeaders
          (PeerManagerImpl *this,CNode *node,Peer *peer,DataStream *vRecv)

{
  uint256 *puVar1;
  CConnman *this_00;
  string msg_type;
  void *pvVar2;
  uint8_t filter_type;
  uint32_t start_height_00;
  bool bVar3;
  CBlockIndex *block_index;
  Logger *pLVar4;
  string *psVar5;
  DataStream *__nbytes;
  ulong uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  uint *args_1_00;
  vector<uint256,_std::allocator<uint256>_> filter_hashes;
  BlockFilterIndex *filter_index;
  CBlockIndex *stop_index;
  uint32_t start_height;
  uint8_t filter_type_ser;
  uint256 local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined8 local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  uint256 prev_header;
  uint256 stop_hash;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined8 uStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint8_t obj;
  undefined4 uStack_6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  __nbytes = vRecv;
  DataStream::read(vRecv,(int)&obj,(void *)0x1,(size_t)vRecv);
  filter_type = obj;
  filter_type_ser = obj;
  DataStream::read(vRecv,(int)&obj,(void *)0x4,(size_t)__nbytes);
  start_height_00 = _obj;
  start_height = _obj;
  DataStream::read(vRecv,(int)&stop_hash,(void *)0x20,(size_t)__nbytes);
  bVar3 = PrepareBlockFilterRequest
                    (this,node,(Peer *)peer->m_our_services,filter_type,start_height_00,&stop_hash,
                     2000,&stop_index,&filter_index);
  if (!bVar3) goto LAB_00900ed7;
  prev_header.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  if (start_height_00 == 0) {
LAB_00900ca6:
    filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = BlockFilterIndex::LookupFilterHashRange
                      (filter_index,start_height_00,stop_index,&filter_hashes);
    if (bVar3) {
      local_f8 = &local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"cfheaders","");
      puVar1 = stop_index->phashBlock;
      if (puVar1 == (uint256 *)0x0) {
LAB_00900f02:
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_118.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      local_118.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_118.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_118.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      this_00 = this->m_connman;
      if (local_f8 == &local_e8) {
        local_88._8_8_ = local_e8._8_8_;
        local_98 = &local_88;
      }
      else {
        local_98 = local_f8;
      }
      local_88._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
      local_88._M_local_buf[0] = local_e8._M_local_buf[0];
      uStack_90 = local_f0;
      local_f0 = 0;
      local_e8._M_local_buf[0] = '\0';
      msg_type._M_string_length = (size_type)node;
      msg_type._M_dataplus._M_p = (pointer)this;
      msg_type.field_2._M_allocated_capacity =
           (size_type)
           filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
      msg_type.field_2._8_8_ =
           filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_f8 = &local_e8;
      NetMsg::Make<unsigned_char&,uint256,uint256&,std::vector<uint256,std::allocator<uint256>>&>
                ((CSerializedNetMsg *)&obj,(NetMsg *)&local_98,msg_type,&filter_type_ser,&local_118,
                 &prev_header,&filter_hashes);
      CConnman::PushMessage(this_00,node,(CSerializedNetMsg *)&obj);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._8_8_ != &local_48) {
        operator_delete((void *)local_60._8_8_,local_48._M_allocated_capacity + 1);
      }
      pvVar2 = (void *)CONCAT44(uStack_6c,_obj);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_60._M_allocated_capacity - (long)pvVar2);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88._M_allocated_capacity + 1);
      }
      if (local_f8 != &local_e8) {
        local_60._M_allocated_capacity =
             CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
        paVar7 = local_f8;
LAB_00900eb8:
        operator_delete(paVar7,local_60._M_allocated_capacity + 1);
      }
    }
    else {
      pLVar4 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,NET,Debug);
      if (bVar3) {
        psVar5 = BlockFilterTypeName_abi_cxx11_(filter_type);
        args_1_00 = (uint *)0x900d8b;
        base_blob<256u>::ToString_abi_cxx11_((string *)&obj,&stop_hash);
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_00._M_len = 0x5b;
        logging_function_00._M_str = "ProcessGetCFHeaders";
        logging_function_00._M_len = 0x13;
        LogPrintf_<std::__cxx11::string,unsigned_int,std::__cxx11::string>
                  (logging_function_00,source_file_00,0xded,
                   IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|PRUNE|CMPCTBLOCK|SELECTCOINS|ADDRMAN|
                   ESTIMATEFEE|RPC|WALLETDB|BENCH|HTTP|MEMPOOL|NET,(Level)psVar5,
                   (char *)&start_height,(string *)&obj,args_1_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT44(uStack_6c,_obj);
        if (paVar7 != &local_60) goto LAB_00900eb8;
      }
    }
    if (filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00900ed7;
    uVar6 = (long)filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  else {
    block_index = CBlockIndex::GetAncestor(stop_index,start_height_00 - 1);
    bVar3 = BlockFilterIndex::LookupFilterHeader(filter_index,block_index,&prev_header);
    if (bVar3) goto LAB_00900ca6;
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,NET,Debug);
    if (!bVar3) goto LAB_00900ed7;
    psVar5 = BlockFilterTypeName_abi_cxx11_(filter_type);
    puVar1 = block_index->phashBlock;
    if (puVar1 == (uint256 *)0x0) goto LAB_00900f02;
    local_98 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)(puVar1->super_base_blob<256U>).m_data._M_elems;
    uStack_90 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    local_88._M_allocated_capacity =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_88._8_8_ = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x900c3b;
    base_blob<256u>::ToString_abi_cxx11_((string *)&obj,&local_98);
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
    ;
    source_file._M_len = 0x5b;
    logging_function._M_str = "ProcessGetCFHeaders";
    logging_function._M_len = 0x13;
    ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0xde5,NET,0xfa5791,(char *)psVar5,(string *)&obj,args_1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_6c,_obj) == &local_60) goto LAB_00900ed7;
    uVar6 = local_60._M_allocated_capacity + 1;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT44(uStack_6c,_obj);
  }
  operator_delete(paVar7,uVar6);
LAB_00900ed7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetCFHeaders(CNode& node, Peer& peer, DataStream& vRecv)
{
    uint8_t filter_type_ser;
    uint32_t start_height;
    uint256 stop_hash;

    vRecv >> filter_type_ser >> start_height >> stop_hash;

    const BlockFilterType filter_type = static_cast<BlockFilterType>(filter_type_ser);

    const CBlockIndex* stop_index;
    BlockFilterIndex* filter_index;
    if (!PrepareBlockFilterRequest(node, peer, filter_type, start_height, stop_hash,
                                   MAX_GETCFHEADERS_SIZE, stop_index, filter_index)) {
        return;
    }

    uint256 prev_header;
    if (start_height > 0) {
        const CBlockIndex* const prev_block =
            stop_index->GetAncestor(static_cast<int>(start_height - 1));
        if (!filter_index->LookupFilterHeader(prev_block, prev_header)) {
            LogDebug(BCLog::NET, "Failed to find block filter header in index: filter_type=%s, block_hash=%s\n",
                         BlockFilterTypeName(filter_type), prev_block->GetBlockHash().ToString());
            return;
        }
    }

    std::vector<uint256> filter_hashes;
    if (!filter_index->LookupFilterHashRange(start_height, stop_index, filter_hashes)) {
        LogDebug(BCLog::NET, "Failed to find block filter hashes in index: filter_type=%s, start_height=%d, stop_hash=%s\n",
                     BlockFilterTypeName(filter_type), start_height, stop_hash.ToString());
        return;
    }

    MakeAndPushMessage(node, NetMsgType::CFHEADERS,
              filter_type_ser,
              stop_index->GetBlockHash(),
              prev_header,
              filter_hashes);
}